

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O2

void ogl_draw_bitmap_region
               (ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR tint,float sx,float sy,float sw,float sh,
               int flags)

{
  undefined8 uVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Bool _Var7;
  uint uVar8;
  ALLEGRO_BITMAP *bitmap_00;
  ALLEGRO_DISPLAY *pAVar9;
  ALLEGRO_TRANSFORM *trans;
  float *x;
  ALLEGRO_BITMAP *bitmap_01;
  float fVar10;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM3_Db;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 in_XMM4_Db;
  float fVar22;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined4 in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  uint uVar24;
  uint uVar26;
  undefined1 in_XMM6 [16];
  undefined1 auVar25 [12];
  uint uVar27;
  undefined1 auVar23 [16];
  ALLEGRO_COLOR tint_00;
  float ytrans;
  float xtrans;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 local_68;
  float *local_58;
  undefined1 local_48 [16];
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  undefined1 auVar20 [16];
  
  auVar25 = in_XMM6._4_12_;
  local_58 = tint._0_8_;
  local_88._4_4_ = in_XMM5_Db;
  local_88._0_4_ = sh;
  local_88._8_4_ = in_XMM5_Dc;
  local_88._12_4_ = in_XMM5_Dd;
  local_98._4_4_ = in_XMM4_Db;
  local_98._0_4_ = sw;
  local_98._8_4_ = in_XMM4_Dc;
  local_98._12_4_ = in_XMM4_Dd;
  local_78 = (float *)CONCAT44(in_XMM3_Db,sy);
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = tint._8_8_;
  local_48._12_4_ = in_XMM1_Dd;
  local_68._0_4_ = sx;
  local_68._4_4_ = in_XMM2_Db;
  bitmap_00 = al_get_target_bitmap();
  pAVar9 = _al_get_bitmap_display(bitmap_00);
  bitmap_01 = bitmap_00->parent;
  if (bitmap_00->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap_01 = bitmap_00;
  }
  pvVar3 = bitmap_01->extra;
  uVar8 = al_get_bitmap_flags(bitmap);
  if (((((uVar8 & 1) == 0) && (bitmap->locked == false)) && (bitmap_01->locked == false)) &&
     (*(char *)((long)bitmap->extra + 0x38) == '\x01')) {
    trans = al_get_current_transform();
    _Var7 = _al_transform_is_translation(trans,&xtrans,&ytrans);
    if (_Var7) {
      if (*(long *)((long)pvVar3 + 0x10) != 0) {
        _al_ogl_set_target_bitmap(pAVar9,bitmap);
      }
      fVar10 = (float)bitmap_01->cl;
      if (xtrans < fVar10) {
        local_68._0_4_ = (float)local_68 - (xtrans - fVar10);
        local_98._0_4_ = (float)local_98._0_4_ + (xtrans - fVar10);
        xtrans = fVar10;
      }
      fVar10 = (float)bitmap_01->ct;
      if (ytrans < fVar10) {
        local_78 = (float *)CONCAT44(local_78._4_4_,(float)local_78 - (ytrans - fVar10));
        local_88._0_4_ = local_88._0_4_ + (ytrans - fVar10);
        ytrans = fVar10;
      }
      uVar24 = auVar25._0_4_;
      uVar26 = auVar25._4_4_;
      uVar27 = auVar25._8_4_;
      uVar8 = -(uint)((float)bitmap_01->cr_excl < (float)local_98._0_4_ + xtrans);
      auVar17._0_4_ = (uint)((float)bitmap_01->cr_excl - xtrans) & uVar8;
      auVar17._4_4_ = uVar24;
      auVar17._8_4_ = uVar26;
      auVar17._12_4_ = uVar27;
      auVar23._0_4_ = ~uVar8 & local_98._0_4_;
      auVar23._4_4_ = ~uVar24 & local_98._4_4_;
      auVar23._8_4_ = ~uVar26 & local_98._8_4_;
      auVar23._12_4_ = ~uVar27 & local_98._12_4_;
      uVar8 = -(uint)((float)bitmap_01->cb_excl < local_88._0_4_ + ytrans);
      auVar18._0_4_ = ~uVar8 & (uint)local_88._0_4_;
      auVar18._4_4_ = ~uVar24 & local_88._4_4_;
      auVar18._8_4_ = ~uVar26 & local_88._8_4_;
      auVar18._12_4_ = ~uVar27 & local_88._12_4_;
      auVar21._4_4_ = uVar24;
      auVar21._0_4_ = (uint)((float)bitmap_01->cb_excl - ytrans) & uVar8;
      auVar21._8_4_ = uVar26;
      auVar21._12_4_ = uVar27;
      local_98 = auVar18 | auVar21;
      local_88 = auVar23 | auVar17;
      glBindTexture(0xde1,*(undefined4 *)((long)pvVar3 + 8));
      glCopyTexSubImage2D(0xde1,0,(int)xtrans,
                          (int)(((float)bitmap_01->h - ytrans) - (float)local_98._0_4_),
                          (int)(float)local_68,
                          (int)(((float)bitmap->h - (float)local_78) - (float)local_98._0_4_),
                          (int)(float)local_88._0_4_,(int)(float)local_98._0_4_);
      if (*(long *)((long)pvVar3 + 0x10) == 0) {
        return;
      }
      _al_ogl_set_target_bitmap(pAVar9,bitmap_01);
      return;
    }
  }
  auVar21 = local_48;
  if (pAVar9->ogl_extras->opengl_target == bitmap_01) {
    puVar4 = (undefined8 *)bitmap->extra;
    pAVar9 = al_get_current_display();
    if ((pAVar9->num_cache_vertices != 0) && (pAVar9->cache_texture != (ulong)*(uint *)(puVar4 + 1))
       ) {
      (*pAVar9->vt->flush_vertex_cache)(pAVar9);
    }
    pAVar9->cache_texture = (ulong)*(uint *)(puVar4 + 1);
    x = (float *)(*pAVar9->vt->prepare_vertex_cache)(pAVar9,6);
    auVar11._8_8_ = extraout_XMM0_Qb;
    auVar11._0_8_ = extraout_XMM0_Qa;
    auVar12._4_12_ = auVar11._4_12_;
    iVar2 = bitmap->h;
    auVar12._0_4_ = ((float)bitmap->w - (float)local_68) - (float)local_98._0_4_;
    fVar10 = *(float *)(puVar4 + 5);
    fVar22 = *(float *)((long)puVar4 + 0x34);
    *x = 0.0;
    x[1] = (float)local_88._0_4_;
    x[2] = 0.0;
    fVar15 = (float)(int)*puVar4;
    fVar16 = (float)(int)((ulong)*puVar4 >> 0x20);
    auVar20._8_4_ = local_68._4_4_;
    auVar20._0_8_ = local_68;
    auVar20._12_4_ = in_XMM2_Db;
    auVar19._8_8_ = auVar20._8_8_;
    auVar19._4_4_ = ((float)iVar2 - (float)local_78) - (float)local_88._0_4_;
    auVar19._0_4_ = (float)local_68;
    auVar5._4_4_ = fVar16;
    auVar5._0_4_ = fVar15;
    auVar5._8_8_ = 0;
    auVar21 = divps(auVar19,auVar5);
    fVar10 = auVar21._0_4_ + fVar10;
    fVar22 = auVar21._4_4_ + fVar22;
    *(float **)(x + 5) = local_58;
    *(undefined8 *)(x + 7) = local_48._0_8_;
    x[0xb] = 0.0;
    x[0xc] = fVar10;
    *(float **)(x + 0xe) = local_58;
    *(undefined8 *)(x + 0x10) = local_48._0_8_;
    x[0x12] = (float)local_98._0_4_;
    x[0x13] = (float)local_88._0_4_;
    x[0x14] = 0.0;
    x[0x16] = fVar22;
    *(float **)(x + 0x17) = local_58;
    *(undefined8 *)(x + 0x19) = local_48._0_8_;
    x[0x24] = (float)local_98._0_4_;
    uVar1 = *(undefined8 *)((long)puVar4 + 0x2c);
    auVar14._0_8_ = auVar12._0_8_;
    auVar14._8_4_ = (int)((ulong)extraout_XMM0_Qa >> 0x20);
    auVar14._12_4_ = local_78._4_4_;
    auVar13._8_8_ = auVar14._8_8_;
    auVar13._4_4_ = (float)local_78;
    auVar13._0_4_ = auVar12._0_4_;
    *(ulong *)(x + 3) = CONCAT44(fVar22,fVar10);
    x[9] = 0.0;
    x[10] = 0.0;
    auVar6._4_4_ = fVar16;
    auVar6._0_4_ = fVar15;
    auVar6._8_8_ = 0;
    auVar21 = divps(auVar13,auVar6);
    fVar10 = (float)((ulong)uVar1 >> 0x20) - auVar21._0_4_;
    fVar22 = (float)uVar1 - auVar21._4_4_;
    x[0xd] = fVar22;
    x[0x15] = fVar10;
    x[0x25] = 0.0;
    x[0x26] = 0.0;
    *(ulong *)(x + 0x27) = CONCAT44(fVar22,fVar10);
    *(float **)(x + 0x29) = local_58;
    *(undefined8 *)(x + 0x2b) = local_48._0_8_;
    if (pAVar9->cache_enabled == true) {
      local_98._0_8_ = x + 0x13;
      local_58 = x + 0x14;
      local_78 = x + 0x24;
      local_68 = x + 0x25;
      local_88._0_8_ = x + 0x26;
      transform_vertex(x,x + 1,x + 2);
      transform_vertex(x + 9,x + 10,x + 0xb);
      transform_vertex(x + 0x12,(float *)local_98._0_8_,local_58);
      transform_vertex(local_78,local_68,(float *)local_88._0_8_);
    }
    x[0x23] = x[0x11];
    *(undefined8 *)(x + 0x1f) = *(undefined8 *)(x + 0xd);
    *(undefined8 *)(x + 0x21) = *(undefined8 *)(x + 0xf);
    *(undefined8 *)(x + 0x1b) = *(undefined8 *)(x + 9);
    *(undefined8 *)(x + 0x1d) = *(undefined8 *)(x + 0xb);
    x[0x35] = x[0x1a];
    x[0x31] = x[0x16];
    x[0x32] = x[0x17];
    x[0x33] = x[0x18];
    x[0x34] = x[0x19];
    *(undefined8 *)(x + 0x2d) = *(undefined8 *)(x + 0x12);
    *(undefined8 *)(x + 0x2f) = *(undefined8 *)(x + 0x14);
    if (pAVar9->cache_enabled == false) {
      (*pAVar9->vt->flush_vertex_cache)(pAVar9);
    }
  }
  else {
    tint_00.b = (float)local_48._0_4_;
    tint_00.a = (float)local_48._4_4_;
    tint_00._0_8_ = local_58;
    local_48 = auVar21;
    _al_draw_bitmap_region_memory
              (bitmap,tint_00,(int)(float)local_68,(int)(float)local_78,(int)(float)local_98._0_4_,
               (int)(float)local_88._0_4_,0,0,flags);
  }
  return;
}

Assistant:

static void ogl_draw_bitmap_region(ALLEGRO_BITMAP *bitmap,
   ALLEGRO_COLOR tint, float sx, float sy,
   float sw, float sh, int flags)
{
   // FIXME: hack
   // FIXME: need format conversion if they don't match
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   ALLEGRO_DISPLAY *disp = _al_get_bitmap_display(target);

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if (!(al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) && !bitmap->locked &&
         !target->locked) {
      ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_source = bitmap->extra;
      if (ogl_source->is_backbuffer) {
         /* Our source bitmap is the OpenGL backbuffer, the target
          * is an OpenGL texture.
          */
         float xtrans, ytrans;

         /* Source and target cannot both be the back-buffer. */
         ASSERT(!ogl_target->is_backbuffer);

         /* If we only translate, we can do this fast. */
         if (_al_transform_is_translation(al_get_current_transform(),
            &xtrans, &ytrans)) {
            /* In general, we can't modify the texture while it's
             * FBO bound - so we temporarily disable the FBO.
             */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, bitmap);
            
            /* We need to do clipping because glCopyTexSubImage2D
             * fails otherwise.
             */
            if (xtrans < target->cl) {
               sx -= xtrans - target->cl;
               sw += xtrans - target->cl;
               xtrans = target->cl;
            }
            if (ytrans < target->ct) {
               sy -= ytrans - target->ct;
               sh += ytrans - target->ct;
               ytrans = target->ct;
            }
            if (xtrans + sw > target->cr_excl) {
               sw = target->cr_excl - xtrans;
            }
            if (ytrans + sh > target->cb_excl) {
               sh = target->cb_excl - ytrans;
            }

            /* Note: Allegro 5.0.0 does not support blending or
             * tinting if the source bitmap is the screen. So it is
             * correct to ignore them here.
             */

            glBindTexture(GL_TEXTURE_2D, ogl_target->texture);
            glCopyTexSubImage2D(GL_TEXTURE_2D, 0,
                xtrans, target->h - ytrans - sh,
                sx, bitmap->h - sy - sh,
                sw, sh);
            /* Fix up FBO again after the copy. */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, target);
            return;
         }
         
         /* Drawing a deformed backbuffer is not supported. */
         ASSERT(0);
      }
   }
   if (disp->ogl_extras->opengl_target == target) {
      draw_quad(bitmap, tint, sx, sy, sw, sh, flags);
      return;
   }

   /* If all else fails, fall back to software implementation. */
   _al_draw_bitmap_region_memory(bitmap, tint, sx, sy, sw, sh, 0, 0, flags);
}